

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O2

string * __thiscall
Kernel::inputTypeName_abi_cxx11_(string *__return_storage_ptr__,Kernel *this,UnitInputType type)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "axiom";
    __a = &local_9;
    break;
  case 1:
    __s = "assumption";
    __a = &local_a;
    break;
  case 2:
    __s = "conjecture";
    __a = &local_b;
    break;
  case 3:
    __s = "negated conjecture";
    __a = &local_c;
    break;
  case 4:
    __s = "claim";
    __a = &local_d;
    break;
  case 5:
    __s = "extensionality axiom";
    __a = &local_e;
    break;
  default:
    __s = "unknown";
    __a = &local_f;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string Kernel::inputTypeName(UnitInputType type)
{
  switch (type) {
    case UnitInputType::AXIOM:
      return "axiom";
    case UnitInputType::ASSUMPTION:
      return "assumption";
    case UnitInputType::CONJECTURE:
      return "conjecture";
    case UnitInputType::NEGATED_CONJECTURE:
      return "negated conjecture";
    case UnitInputType::CLAIM:
      return "claim";
    case UnitInputType::EXTENSIONALITY_AXIOM:
      return "extensionality axiom";
  default:
      return "unknown";
  }
}